

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

void __thiscall
helics::apps::Connector::scanUnconnectedInterfaces
          (Connector *this,ConnectionsList *possibleConnections)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  string_view interface;
  string_view interface_00;
  string_view interface_01;
  string_view interface_02;
  string_view interface_03;
  string_view interface_04;
  string_view interface_05;
  string_view interface_06;
  string_view target;
  string_view target_00;
  string_view target_01;
  string_view target_02;
  bool bVar1;
  reference pbVar2;
  long in_RSI;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> *alias_3;
  iterator __end4_3;
  iterator __begin4_3;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range4_3;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  aliasList_3;
  basic_string_view<char,_std::char_traits<char>_> *uEnd_1;
  iterator __end2_3;
  iterator __begin2_3;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range2_3;
  basic_string_view<char,_std::char_traits<char>_> *alias_2;
  iterator __end4_2;
  iterator __begin4_2;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range4_2;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  aliasList_2;
  basic_string_view<char,_std::char_traits<char>_> *uEnd;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range2_2;
  basic_string_view<char,_std::char_traits<char>_> *alias_1;
  iterator __end4_1;
  iterator __begin4_1;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range4_1;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  aliasList_1;
  basic_string_view<char,_std::char_traits<char>_> *uPub;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range2_1;
  basic_string_view<char,_std::char_traits<char>_> *alias;
  iterator __end4;
  iterator __begin4;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range4;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  aliasList;
  basic_string_view<char,_std::char_traits<char>_> *uInp;
  iterator __end2;
  iterator __begin2;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range2;
  undefined4 in_stack_fffffffffffffcc8;
  undefined1 in_stack_fffffffffffffccc;
  undefined1 in_stack_fffffffffffffccd;
  undefined1 in_stack_fffffffffffffcce;
  undefined1 in_stack_fffffffffffffccf;
  size_t in_stack_fffffffffffffce8;
  char *in_stack_fffffffffffffcf0;
  size_t in_stack_fffffffffffffcf8;
  char *in_stack_fffffffffffffd00;
  _Self local_2f0;
  _Self local_2e8;
  undefined1 *local_2e0;
  size_t local_2d8;
  char *local_2d0;
  undefined1 local_2c8 [48];
  size_t local_298;
  char *local_290;
  basic_string_view<char,_std::char_traits<char>_> *local_288;
  basic_string_view<char,_std::char_traits<char>_> *local_280;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_278;
  long local_270;
  _func_int **local_268;
  element_type *peStack_260;
  size_t local_258;
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *in_stack_fffffffffffffdb0;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  *in_stack_fffffffffffffdb8;
  element_type *in_stack_fffffffffffffdc0;
  Connector *in_stack_fffffffffffffdc8;
  iterator in_stack_fffffffffffffdd0;
  iterator in_stack_fffffffffffffdd8;
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe30;
  reference in_stack_fffffffffffffe38;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_1b8;
  long local_1b0;
  size_t local_1a8;
  char *pcStack_1a0;
  size_t local_198;
  char *local_190;
  size_t local_188;
  char *local_180;
  reference local_178;
  _Self local_170;
  _Self local_168;
  undefined1 *local_160;
  size_t local_158;
  char *local_150;
  undefined1 local_148 [48];
  size_t local_118;
  char *local_110;
  reference local_108;
  basic_string_view<char,_std::char_traits<char>_> *local_100;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_f8;
  long local_f0;
  size_t local_d8;
  char *pcStack_d0;
  size_t local_c0;
  char *local_b8;
  size_t local_b0;
  char *local_a8;
  reference local_a0;
  _Self local_98;
  _Self local_90;
  undefined1 *local_88;
  size_t local_80;
  char *local_78;
  undefined1 local_70 [48];
  size_t local_40;
  char *local_38;
  reference local_30;
  basic_string_view<char,_std::char_traits<char>_> *local_28;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_20;
  long local_18;
  long local_10;
  
  local_18 = in_RSI + 0x50;
  local_10 = in_RSI;
  local_20._M_current =
       (basic_string_view<char,_std::char_traits<char>_> *)
       CLI::std::
       vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffccf,
                           CONCAT16(in_stack_fffffffffffffcce,
                                    CONCAT15(in_stack_fffffffffffffccd,
                                             CONCAT14(in_stack_fffffffffffffccc,
                                                      in_stack_fffffffffffffcc8)))));
  local_28 = (basic_string_view<char,_std::char_traits<char>_> *)
             CLI::std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffccf,
                               CONCAT16(in_stack_fffffffffffffcce,
                                        CONCAT15(in_stack_fffffffffffffccd,
                                                 CONCAT14(in_stack_fffffffffffffccc,
                                                          in_stack_fffffffffffffcc8)))));
  do {
    bVar1 = __gnu_cxx::
            operator==<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                      (in_RDI,(__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                               *)CONCAT17(in_stack_fffffffffffffccf,
                                          CONCAT16(in_stack_fffffffffffffcce,
                                                   CONCAT15(in_stack_fffffffffffffccd,
                                                            CONCAT14(in_stack_fffffffffffffccc,
                                                                     in_stack_fffffffffffffcc8)))));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_f0 = local_10 + 0x38;
      local_f8._M_current =
           (basic_string_view<char,_std::char_traits<char>_> *)
           CLI::std::
           vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffccf,
                               CONCAT16(in_stack_fffffffffffffcce,
                                        CONCAT15(in_stack_fffffffffffffccd,
                                                 CONCAT14(in_stack_fffffffffffffccc,
                                                          in_stack_fffffffffffffcc8)))));
      local_100 = (basic_string_view<char,_std::char_traits<char>_> *)
                  CLI::std::
                  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)CONCAT17(in_stack_fffffffffffffccf,
                                    CONCAT16(in_stack_fffffffffffffcce,
                                             CONCAT15(in_stack_fffffffffffffccd,
                                                      CONCAT14(in_stack_fffffffffffffccc,
                                                               in_stack_fffffffffffffcc8)))));
      do {
        bVar1 = __gnu_cxx::
                operator==<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                          (in_RDI,(__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffccf,
                                              CONCAT16(in_stack_fffffffffffffcce,
                                                       CONCAT15(in_stack_fffffffffffffccd,
                                                                CONCAT14(in_stack_fffffffffffffccc,
                                                                         in_stack_fffffffffffffcc8))
                                                      )));
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          local_1b0 = local_10 + 0x80;
          local_1b8._M_current =
               (basic_string_view<char,_std::char_traits<char>_> *)
               CLI::std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffccf,
                                   CONCAT16(in_stack_fffffffffffffcce,
                                            CONCAT15(in_stack_fffffffffffffccd,
                                                     CONCAT14(in_stack_fffffffffffffccc,
                                                              in_stack_fffffffffffffcc8)))));
          CLI::std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffffccf,
                            CONCAT16(in_stack_fffffffffffffcce,
                                     CONCAT15(in_stack_fffffffffffffccd,
                                              CONCAT14(in_stack_fffffffffffffccc,
                                                       in_stack_fffffffffffffcc8)))));
          do {
            bVar1 = __gnu_cxx::
                    operator==<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                              (in_RDI,(__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                       *)CONCAT17(in_stack_fffffffffffffccf,
                                                  CONCAT16(in_stack_fffffffffffffcce,
                                                           CONCAT15(in_stack_fffffffffffffccd,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffccc,
                                                  in_stack_fffffffffffffcc8)))));
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              local_270 = local_10 + 0x68;
              local_278._M_current =
                   (basic_string_view<char,_std::char_traits<char>_> *)
                   CLI::std::
                   vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            *)CONCAT17(in_stack_fffffffffffffccf,
                                       CONCAT16(in_stack_fffffffffffffcce,
                                                CONCAT15(in_stack_fffffffffffffccd,
                                                         CONCAT14(in_stack_fffffffffffffccc,
                                                                  in_stack_fffffffffffffcc8)))));
              local_280 = (basic_string_view<char,_std::char_traits<char>_> *)
                          CLI::std::
                          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffccf,
                                            CONCAT16(in_stack_fffffffffffffcce,
                                                     CONCAT15(in_stack_fffffffffffffccd,
                                                              CONCAT14(in_stack_fffffffffffffccc,
                                                                       in_stack_fffffffffffffcc8))))
                               );
              do {
                bVar1 = __gnu_cxx::
                        operator==<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                  (in_RDI,(__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                           *)CONCAT17(in_stack_fffffffffffffccf,
                                                      CONCAT16(in_stack_fffffffffffffcce,
                                                               CONCAT15(in_stack_fffffffffffffccd,
                                                                        CONCAT14(
                                                  in_stack_fffffffffffffccc,
                                                  in_stack_fffffffffffffcc8)))));
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  return;
                }
                local_288 = __gnu_cxx::
                            __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                            ::operator*(&local_278);
                local_298 = local_288->_M_len;
                local_290 = local_288->_M_str;
                interface_05._M_str = (char *)in_stack_fffffffffffffdd8._M_node;
                interface_05._M_len = (size_t)in_stack_fffffffffffffdd0._M_node;
                bVar1 = makePotentialConnection
                                  (in_stack_fffffffffffffdc8,interface_05,
                                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                                   in_stack_fffffffffffffdb0);
                if ((!bVar1) &&
                   (bVar1 = CLI::std::
                            unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                            ::empty((unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                     *)0x2688cb), !bVar1)) {
                  local_2d8 = local_288->_M_len;
                  local_2d0 = local_288->_M_str;
                  target_02._M_str = (char *)in_stack_fffffffffffffe38;
                  target_02._M_len = (size_t)in_stack_fffffffffffffe30;
                  generateAliases(target_02,in_stack_fffffffffffffe28);
                  local_2e0 = local_2c8;
                  local_2e8._M_node =
                       (_Base_ptr)
                       CLI::std::
                       set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ::begin((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                *)CONCAT17(in_stack_fffffffffffffccf,
                                           CONCAT16(in_stack_fffffffffffffcce,
                                                    CONCAT15(in_stack_fffffffffffffccd,
                                                             CONCAT14(in_stack_fffffffffffffccc,
                                                                      in_stack_fffffffffffffcc8)))))
                  ;
                  local_2f0._M_node =
                       (_Base_ptr)
                       CLI::std::
                       set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ::end((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              *)CONCAT17(in_stack_fffffffffffffccf,
                                         CONCAT16(in_stack_fffffffffffffcce,
                                                  CONCAT15(in_stack_fffffffffffffccd,
                                                           CONCAT14(in_stack_fffffffffffffccc,
                                                                    in_stack_fffffffffffffcc8)))));
                  while (bVar1 = CLI::std::operator==(&local_2e8,&local_2f0),
                        ((bVar1 ^ 0xffU) & 1) != 0) {
                    pbVar2 = CLI::std::
                             _Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>
                             ::operator*((_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>
                                          *)0x268954);
                    bVar1 = std::operator==(*pbVar2,*local_288);
                    if ((!bVar1) &&
                       (interface_06._M_str = (char *)in_stack_fffffffffffffdd8._M_node,
                       interface_06._M_len = (size_t)in_stack_fffffffffffffdd0._M_node,
                       in_stack_fffffffffffffccc =
                            makePotentialConnection
                                      (in_stack_fffffffffffffdc8,interface_06,
                                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                                       in_stack_fffffffffffffdb0), (bool)in_stack_fffffffffffffccc))
                    break;
                    CLI::std::
                    _Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>
                    ::operator++((_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>
                                  *)in_RDI);
                  }
                  CLI::std::
                  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::~set((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)0x268a33);
                }
                __gnu_cxx::
                __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                ::operator++(&local_278);
              } while( true );
            }
            in_stack_fffffffffffffe38 =
                 __gnu_cxx::
                 __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 ::operator*(&local_1b8);
            in_stack_fffffffffffffe28 =
                 (unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  *)in_stack_fffffffffffffe38->_M_len;
            in_stack_fffffffffffffe30 = in_stack_fffffffffffffe38->_M_str;
            interface_03._M_str = (char *)in_stack_fffffffffffffdd8._M_node;
            interface_03._M_len = (size_t)in_stack_fffffffffffffdd0._M_node;
            bVar1 = makePotentialConnection
                              (in_stack_fffffffffffffdc8,interface_03,
                               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                               in_stack_fffffffffffffdb0);
            if ((!bVar1) &&
               (bVar1 = CLI::std::
                        unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                        ::empty((unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                 *)0x268602), !bVar1)) {
              target_01._M_str = (char *)in_stack_fffffffffffffe38;
              target_01._M_len = (size_t)in_stack_fffffffffffffe30;
              generateAliases(target_01,in_stack_fffffffffffffe28);
              in_stack_fffffffffffffdd8 =
                   CLI::std::
                   set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::begin((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            *)CONCAT17(in_stack_fffffffffffffccf,
                                       CONCAT16(in_stack_fffffffffffffcce,
                                                CONCAT15(in_stack_fffffffffffffccd,
                                                         CONCAT14(in_stack_fffffffffffffccc,
                                                                  in_stack_fffffffffffffcc8)))));
              in_stack_fffffffffffffdd0 =
                   CLI::std::
                   set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::end((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffccf,
                                     CONCAT16(in_stack_fffffffffffffcce,
                                              CONCAT15(in_stack_fffffffffffffccd,
                                                       CONCAT14(in_stack_fffffffffffffccc,
                                                                in_stack_fffffffffffffcc8)))));
              while (bVar1 = CLI::std::operator==
                                       ((_Self *)&stack0xfffffffffffffdd8,
                                        (_Self *)&stack0xfffffffffffffdd0),
                    ((bVar1 ^ 0xffU) & 1) != 0) {
                in_stack_fffffffffffffdc8 =
                     (Connector *)
                     CLI::std::
                     _Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>
                     ::operator*((_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>
                                  *)0x2686b5);
                in_stack_fffffffffffffdb8 =
                     (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
                      *)(in_stack_fffffffffffffdc8->super_App)._vptr_App;
                in_stack_fffffffffffffdc0 =
                     (in_stack_fffffffffffffdc8->super_App).fed.
                     super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
                local_258 = in_stack_fffffffffffffe38->_M_len;
                in_stack_fffffffffffffdb0 =
                     (unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                      *)in_stack_fffffffffffffe38->_M_str;
                __x_01._M_str = in_stack_fffffffffffffd00;
                __x_01._M_len = in_stack_fffffffffffffcf8;
                __y_01._M_str = in_stack_fffffffffffffcf0;
                __y_01._M_len = in_stack_fffffffffffffce8;
                bVar1 = std::operator==(__x_01,__y_01);
                if (!bVar1) {
                  local_268 = (in_stack_fffffffffffffdc8->super_App)._vptr_App;
                  peStack_260 = (in_stack_fffffffffffffdc8->super_App).fed.
                                super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr;
                  interface_04._M_str = (char *)in_stack_fffffffffffffdd8._M_node;
                  interface_04._M_len = (size_t)in_stack_fffffffffffffdd0._M_node;
                  in_stack_fffffffffffffccd =
                       makePotentialConnection
                                 (in_stack_fffffffffffffdc8,interface_04,
                                  (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                                  in_stack_fffffffffffffdb0);
                  if ((bool)in_stack_fffffffffffffccd) break;
                }
                CLI::std::
                _Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>::
                operator++((_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>
                            *)in_RDI);
              }
              CLI::std::
              set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::~set((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)0x2687cd);
            }
            __gnu_cxx::
            __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            ::operator++(&local_1b8);
          } while( true );
        }
        local_108 = __gnu_cxx::
                    __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                    ::operator*(&local_f8);
        local_118 = local_108->_M_len;
        local_110 = local_108->_M_str;
        interface_01._M_str = (char *)in_stack_fffffffffffffdd8._M_node;
        interface_01._M_len = (size_t)in_stack_fffffffffffffdd0._M_node;
        bVar1 = makePotentialConnection
                          (in_stack_fffffffffffffdc8,interface_01,
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                           in_stack_fffffffffffffdb0);
        if ((!bVar1) &&
           (bVar1 = CLI::std::
                    unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                    ::empty((unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                             *)0x268337), !bVar1)) {
          local_158 = local_108->_M_len;
          local_150 = local_108->_M_str;
          target_00._M_str = (char *)in_stack_fffffffffffffe38;
          target_00._M_len = (size_t)in_stack_fffffffffffffe30;
          generateAliases(target_00,in_stack_fffffffffffffe28);
          local_160 = local_148;
          local_168._M_node =
               (_Base_ptr)
               CLI::std::
               set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::begin((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffccf,
                                   CONCAT16(in_stack_fffffffffffffcce,
                                            CONCAT15(in_stack_fffffffffffffccd,
                                                     CONCAT14(in_stack_fffffffffffffccc,
                                                              in_stack_fffffffffffffcc8)))));
          local_170._M_node =
               (_Base_ptr)
               CLI::std::
               set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::end((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffffccf,
                                 CONCAT16(in_stack_fffffffffffffcce,
                                          CONCAT15(in_stack_fffffffffffffccd,
                                                   CONCAT14(in_stack_fffffffffffffccc,
                                                            in_stack_fffffffffffffcc8)))));
          while (bVar1 = CLI::std::operator==(&local_168,&local_170), ((bVar1 ^ 0xffU) & 1) != 0) {
            local_178 = CLI::std::
                        _Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>
                        ::operator*((_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>
                                     *)0x2683ea);
            local_188 = local_178->_M_len;
            local_180 = local_178->_M_str;
            local_198 = local_108->_M_len;
            local_190 = local_108->_M_str;
            __x_00._M_str = in_stack_fffffffffffffd00;
            __x_00._M_len = in_stack_fffffffffffffcf8;
            __y_00._M_str = in_stack_fffffffffffffcf0;
            __y_00._M_len = in_stack_fffffffffffffce8;
            bVar1 = std::operator==(__x_00,__y_00);
            if (!bVar1) {
              local_1a8 = local_178->_M_len;
              pcStack_1a0 = local_178->_M_str;
              interface_02._M_str = (char *)in_stack_fffffffffffffdd8._M_node;
              interface_02._M_len = (size_t)in_stack_fffffffffffffdd0._M_node;
              in_stack_fffffffffffffcce =
                   makePotentialConnection
                             (in_stack_fffffffffffffdc8,interface_02,
                              (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                              in_stack_fffffffffffffdb0);
              if ((bool)in_stack_fffffffffffffcce) break;
            }
            CLI::std::
            _Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>::
            operator++((_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>
                        *)in_RDI);
          }
          CLI::std::
          set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::~set((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)0x268502);
        }
        __gnu_cxx::
        __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
        ::operator++(&local_f8);
      } while( true );
    }
    local_30 = __gnu_cxx::
               __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               ::operator*(&local_20);
    local_40 = local_30->_M_len;
    local_38 = local_30->_M_str;
    interface._M_str = (char *)in_stack_fffffffffffffdd8._M_node;
    interface._M_len = (size_t)in_stack_fffffffffffffdd0._M_node;
    bVar1 = makePotentialConnection
                      (in_stack_fffffffffffffdc8,interface,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0
                      );
    if ((!bVar1) &&
       (bVar1 = CLI::std::
                unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                ::empty((unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                         *)0x26806e), !bVar1)) {
      local_80 = local_30->_M_len;
      local_78 = local_30->_M_str;
      target._M_str = (char *)in_stack_fffffffffffffe38;
      target._M_len = (size_t)in_stack_fffffffffffffe30;
      generateAliases(target,in_stack_fffffffffffffe28);
      local_88 = local_70;
      local_90._M_node =
           (_Base_ptr)
           CLI::std::
           set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::begin((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffccf,
                               CONCAT16(in_stack_fffffffffffffcce,
                                        CONCAT15(in_stack_fffffffffffffccd,
                                                 CONCAT14(in_stack_fffffffffffffccc,
                                                          in_stack_fffffffffffffcc8)))));
      local_98._M_node =
           (_Base_ptr)
           CLI::std::
           set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::end((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffccf,
                             CONCAT16(in_stack_fffffffffffffcce,
                                      CONCAT15(in_stack_fffffffffffffccd,
                                               CONCAT14(in_stack_fffffffffffffccc,
                                                        in_stack_fffffffffffffcc8)))));
      while (bVar1 = CLI::std::operator==(&local_90,&local_98), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_a0 = CLI::std::
                   _Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>::
                   operator*((_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>
                              *)0x268121);
        local_b0 = local_a0->_M_len;
        local_a8 = local_a0->_M_str;
        local_c0 = local_30->_M_len;
        local_b8 = local_30->_M_str;
        __x._M_str = in_stack_fffffffffffffd00;
        __x._M_len = in_stack_fffffffffffffcf8;
        __y._M_str = in_stack_fffffffffffffcf0;
        __y._M_len = in_stack_fffffffffffffce8;
        bVar1 = std::operator==(__x,__y);
        if (!bVar1) {
          local_d8 = local_a0->_M_len;
          pcStack_d0 = local_a0->_M_str;
          interface_00._M_str = (char *)in_stack_fffffffffffffdd8._M_node;
          interface_00._M_len = (size_t)in_stack_fffffffffffffdd0._M_node;
          in_stack_fffffffffffffccf =
               makePotentialConnection
                         (in_stack_fffffffffffffdc8,interface_00,
                          (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                          in_stack_fffffffffffffdb0);
          if ((bool)in_stack_fffffffffffffccf) break;
        }
        CLI::std::_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>::
        operator++((_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>
                    *)in_RDI);
      }
      CLI::std::
      set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~set((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)0x268239);
    }
    __gnu_cxx::
    __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::operator++(&local_20);
  } while( true );
}

Assistant:

void Connector::scanUnconnectedInterfaces(ConnectionsList& possibleConnections)
{
    /** unconnected inputs*/
    for (const auto& uInp : possibleConnections.unconnectedInputs) {
        if (makePotentialConnection(uInp,
                                    possibleConnections.tagCodes,
                                    possibleConnections.potentialPubs,
                                    possibleConnections.aliases)) {
            continue;
        }
        if (!possibleConnections.aliases.empty()) {
            auto aliasList = generateAliases(uInp, possibleConnections.aliases);
            for (const auto& alias : aliasList) {
                if (alias == uInp) {
                    continue;
                }
                if (makePotentialConnection(alias,
                                            possibleConnections.tagCodes,
                                            possibleConnections.potentialPubs,
                                            possibleConnections.aliases)) {
                    break;
                }
            }
        }
    }

    /** unconnected publications*/
    for (const auto& uPub : possibleConnections.unconnectedPubs) {
        if (makePotentialConnection(uPub,
                                    possibleConnections.tagCodes,
                                    possibleConnections.potentialInputs,
                                    possibleConnections.aliases)) {
            continue;
        }
        if (!possibleConnections.aliases.empty()) {
            auto aliasList = generateAliases(uPub, possibleConnections.aliases);
            for (const auto& alias : aliasList) {
                if (alias == uPub) {
                    continue;
                }
                if (makePotentialConnection(alias,
                                            possibleConnections.tagCodes,
                                            possibleConnections.potentialInputs,
                                            possibleConnections.aliases)) {
                    break;
                }
            }
        }
    }

    /** unconnected source endpoints*/
    for (const auto& uEnd : possibleConnections.unconnectedSourceEndpoints) {
        if (makePotentialConnection(uEnd,
                                    possibleConnections.tagCodes,
                                    possibleConnections.potentialEndpoints,
                                    possibleConnections.aliases)) {
            continue;
        }
        if (!possibleConnections.aliases.empty()) {
            auto aliasList = generateAliases(uEnd, possibleConnections.aliases);
            for (const auto& alias : aliasList) {
                if (alias == uEnd) {
                    continue;
                }
                if (makePotentialConnection(alias,
                                            possibleConnections.tagCodes,
                                            possibleConnections.potentialEndpoints,
                                            possibleConnections.aliases)) {
                    break;
                }
            }
        }
    }

    /** unconnected target endpoints*/
    for (const auto& uEnd : possibleConnections.unconnectedTargetEndpoints) {
        if (makePotentialConnection(uEnd,
                                    possibleConnections.tagCodes,
                                    possibleConnections.potentialEndpoints,
                                    possibleConnections.aliases)) {
            continue;
        }
        if (!possibleConnections.aliases.empty()) {
            auto aliasList = generateAliases(uEnd, possibleConnections.aliases);
            for (const auto& alias : aliasList) {
                if (alias == uEnd) {
                    continue;
                }
                if (makePotentialConnection(alias,
                                            possibleConnections.tagCodes,
                                            possibleConnections.potentialEndpoints,
                                            possibleConnections.aliases)) {
                    break;
                }
            }
        }
    }
}